

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  int64_t iVar11;
  int64_t iVar12;
  int64_t iVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  longlong lVar68;
  longlong lVar69;
  longlong lVar70;
  longlong lVar71;
  int iVar72;
  int iVar73;
  long lVar74;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  int64_t *extraout_RDX;
  int64_t *piVar75;
  longlong lVar76;
  ulong extraout_XMM0_Qa;
  ulong uVar77;
  long extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  long lVar78;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  long extraout_XMM0_Qa_04;
  long lVar79;
  long lVar80;
  ulong extraout_XMM0_Qa_05;
  ulong uVar81;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong uVar82;
  ulong extraout_XMM0_Qa_10;
  ulong extraout_XMM0_Qa_11;
  long lVar83;
  ulong extraout_XMM0_Qb;
  ulong uVar84;
  long extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  long extraout_XMM0_Qb_04;
  long lVar85;
  long lVar86;
  ulong extraout_XMM0_Qb_05;
  ulong uVar87;
  ulong uVar88;
  ulong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong uVar89;
  ulong uVar90;
  ulong extraout_XMM0_Qb_10;
  ulong extraout_XMM0_Qb_11;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i alVar94;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  int local_13fc;
  int local_13e4;
  long local_13e0;
  int local_13c4;
  long local_13c0;
  long local_13a8;
  long lStack_13a0;
  long lStack_1390;
  int local_1380;
  int local_137c;
  longlong *plStack_1378;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *ll;
  int64_t *ls;
  int64_t *lm;
  int64_t *lh;
  int64_t *cl;
  int64_t *cs;
  int64_t *cm;
  int64_t *ch;
  int64_t *rl;
  int64_t *rs;
  int64_t *rm;
  int64_t *rh;
  int64_t last_vall;
  int64_t last_vals;
  int64_t last_valm;
  int64_t last_valh;
  int64_t max_coll;
  int64_t max_cols;
  int64_t max_colm;
  int64_t max_colh;
  int64_t max_rowl;
  int64_t max_rows;
  int64_t max_rowm;
  int64_t max_rowh;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case2;
  __m128i case1;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastValL;
  __m128i vLastValS;
  __m128i vLastValM;
  __m128i vLastValH;
  __m128i vMaxLCol;
  __m128i vMaxSCol;
  __m128i vMaxMCol;
  __m128i vMaxHCol;
  __m128i vMaxLRow;
  __m128i vMaxSRow;
  __m128i vMaxMRow;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_dd0;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *FL_pr;
  int64_t *FS_pr;
  int64_t *FM_pr;
  int64_t *F_pr;
  int64_t *HL_pr;
  int64_t *HS_pr;
  int64_t *HM_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_FL_pr;
  int64_t *_FS_pr;
  int64_t *_FM_pr;
  int64_t *_F_pr;
  int64_t *_HL_pr;
  int64_t *_HS_pr;
  int64_t *_HM_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  ulong uStack_100;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_diag_sse41_128_64","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_diag_sse41_128_64","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_diag_sse41_128_64","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_diag_sse41_128_64","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_diag_sse41_128_64","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sg_flags_stats_diag_sse41_128_64");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_diag_sse41_128_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_diag_sse41_128_64","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_1380 = _s1Len;
    if (matrix->type != 0) {
      local_1380 = matrix->length;
    }
    NEG_LIMIT._4_4_ = local_1380 + -1;
    NEG_LIMIT._0_4_ = s2Len - 1;
    if (-open < matrix->min) {
      lVar74 = (long)open;
    }
    else {
      lVar74 = -(long)matrix->min;
    }
    rh = (int64_t *)(lVar74 + -0x7fffffffffffffff);
    if (s1_beg == 0) {
      lStack_1390 = (long)(gap * 2);
    }
    else {
      lStack_1390 = 0;
    }
    vJreset[1] = 1;
    vI[0] = 0;
    vMaxHRow[0] = (longlong)rh;
    vMaxMRow[1] = (longlong)rh;
    vMaxMRow[0] = (longlong)rh;
    vMaxSRow[1] = (longlong)rh;
    vMaxSRow[0] = (longlong)rh;
    vMaxLRow[1] = (longlong)rh;
    vMaxLRow[0] = (longlong)rh;
    vMaxHCol[1] = (longlong)rh;
    vMaxHCol[0] = (longlong)rh;
    vMaxMCol[1] = (longlong)rh;
    vMaxMCol[0] = (longlong)rh;
    vMaxSCol[1] = (longlong)rh;
    vMaxSCol[0] = (longlong)rh;
    vMaxLCol[1] = (longlong)rh;
    vMaxLCol[0] = (longlong)rh;
    vLastValH[1] = (longlong)rh;
    vLastValH[0] = (longlong)rh;
    vLastValM[1] = (longlong)rh;
    vLastValM[0] = (longlong)rh;
    vLastValS[1] = (longlong)rh;
    vLastValS[0] = (longlong)rh;
    vLastValL[1] = (longlong)rh;
    vLastValL[0] = (longlong)rh;
    vEndI[1] = (longlong)rh;
    vEndI[0] = (longlong)rh;
    vEndJ[1] = (longlong)rh;
    vEndJ[0] = (longlong)rh;
    vILimit[1] = (longlong)rh;
    vILimit[0] = (longlong)local_1380;
    lVar74 = vILimit[0] + -1;
    lVar83 = vILimit[0] + -1;
    if (s1_beg == 0) {
      lStack_13a0 = (long)-open;
      local_13a8 = (long)(-open - gap);
    }
    else {
      local_13a8 = 0;
      lStack_13a0 = 0;
    }
    case1[1] = local_13a8;
    vIBoundary[0] = lStack_13a0;
    _s1_local = (char *)parasail_result_new_stats();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x2811002;
      uVar14 = 0;
      if (s1_beg != 0) {
        uVar14 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar14 | ((parasail_result_t *)_s1_local)->flag;
      uVar14 = 0;
      if (s1_end != 0) {
        uVar14 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar14 | ((parasail_result_t *)_s1_local)->flag;
      uVar14 = 0;
      if (s2_beg != 0) {
        uVar14 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar14 | ((parasail_result_t *)_s1_local)->flag;
      uVar14 = 0;
      if (s2_end != 0) {
        uVar14 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar14 | ((parasail_result_t *)_s1_local)->flag;
      ptr = parasail_memalign_int64_t(0x10,(long)(local_1380 + 1));
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_01 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_02 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_03 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_04 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_05 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_06 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      ptr_07 = parasail_memalign_int64_t(0x10,(long)(s2Len + 2));
      a_03[1] = (size_t)(s2Len + 2);
      lVar76 = 0x10;
      ptr_08 = parasail_memalign_int64_t(0x10,a_03[1]);
      if (ptr == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int64_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        piVar75 = extraout_RDX;
        for (end_query = 0; end_query < local_1380; end_query = end_query + 1) {
          piVar75 = (int64_t *)(long)matrix->mapper[(byte)_s1[end_query]];
          ptr[end_query] = (int64_t)piVar75;
        }
        for (end_query = local_1380; end_query < local_1380 + 1; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar75 = (int64_t *)(long)matrix->mapper[(byte)_s2[end_ref]];
          ptr_00[(long)end_ref + 1] = (int64_t)piVar75;
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_00[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_01[(long)end_ref + 1] = (long)(-(end_ref * gap) - open);
            ptr_02[(long)end_ref + 1] = 0;
            ptr_03[(long)end_ref + 1] = 0;
            ptr_04[(long)end_ref + 1] = 0;
            ptr_05[(long)end_ref + 1] = (int64_t)rh;
            ptr_06[(long)end_ref + 1] = 0;
            ptr_07[(long)end_ref + 1] = 0;
            ptr_08[(long)end_ref + 1] = 0;
            piVar75 = rh;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_01[(long)end_ref + 1] = 0;
            ptr_02[(long)end_ref + 1] = 0;
            ptr_03[(long)end_ref + 1] = 0;
            ptr_04[(long)end_ref + 1] = 0;
            ptr_05[(long)end_ref + 1] = (int64_t)rh;
            ptr_06[(long)end_ref + 1] = 0;
            ptr_07[(long)end_ref + 1] = 0;
            ptr_08[(long)end_ref + 1] = 0;
            piVar75 = rh;
          }
        }
        for (end_ref = -1; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 1] = 0;
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = 0;
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 1) {
          ptr_01[(long)end_ref + 1] = 0;
          ptr_02[(long)end_ref + 1] = 0;
          ptr_03[(long)end_ref + 1] = 0;
          ptr_04[(long)end_ref + 1] = 0;
          ptr_05[(long)end_ref + 1] = 0;
          ptr_06[(long)end_ref + 1] = 0;
          ptr_07[(long)end_ref + 1] = 0;
          ptr_08[(long)end_ref + 1] = 0;
          iVar1 = end_ref + 1;
        }
        *ptr_01 = 0;
        for (end_query = 0; uVar77 = (ulong)(s2Len + 1), end_query < local_1380;
            end_query = end_query + 2) {
          vNS[1] = 0;
          vNM[0] = 0;
          vNL[1] = 0;
          vNS[0] = 0;
          vWH[1] = 0;
          vNL[0] = 0;
          stack0xffffffffffffef98 = ZEXT816(0);
          stack0xffffffffffffef88 = ZEXT816(0);
          stack0xffffffffffffef78 = ZEXT816(0);
          stack0xffffffffffffef38 = ZEXT816(0);
          stack0xffffffffffffef28 = ZEXT816(0);
          stack0xffffffffffffef18 = ZEXT816(0);
          stack0xffffffffffffeed8 = ZEXT816(0);
          stack0xffffffffffffeec8 = ZEXT816(0);
          vFL[0] = 0;
          vs1[1] = -1;
          vJ[0] = 0;
          lVar3 = ptr[end_query];
          lVar4 = ptr[(long)end_query + 1];
          piVar5 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_13c0 = ptr[end_query];
          }
          else {
            if (end_query < local_1380) {
              local_13c4 = end_query;
            }
            else {
              local_13c4 = local_1380 + -1;
            }
            local_13c0 = (long)local_13c4;
          }
          piVar6 = matrix->matrix;
          if (matrix->type == 0) {
            local_13e0 = ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_1380) {
              local_13e4 = end_query + 1;
            }
            else {
              local_13e4 = local_1380 + -1;
            }
            local_13e0 = (long)local_13e4;
          }
          b[1] = matrix->size * local_13e0;
          alVar94[1] = a_03[1];
          alVar94[0] = lVar76;
          b[0] = local_13e0;
          alVar94 = _mm_cmplt_epi64_rpl(alVar94,b);
          piVar75 = alVar94[1];
          uVar77 = -(ulong)(vJreset[1] == lVar74);
          uVar84 = -(ulong)(vI[0] == lVar83);
          vNH[0] = *ptr_01;
          if (s1_beg == 0) {
            local_13fc = -(end_query * gap) - open;
          }
          else {
            local_13fc = 0;
          }
          vWH[0] = (long)local_13fc;
          vWM[1] = (longlong)rh;
          *ptr_01 = (long)(-((end_query + 2) * gap) - open);
          vs2[0] = (longlong)rh;
          vNM[1] = (longlong)rh;
          for (end_ref = 0; lVar71 = vNM[1], lVar70 = vNS[1], lVar69 = vNL[1], lVar68 = vWH[1],
              end_ref < s2Len + 1; end_ref = end_ref + 1) {
            vNM[1] = vWH[0];
            iVar7 = ptr_01[(long)end_ref + 1];
            vNS[1] = vWM[0];
            iVar8 = ptr_02[(long)end_ref + 1];
            vNL[1] = vWS[0];
            iVar9 = ptr_03[(long)end_ref + 1];
            vWH[1] = vWL[0];
            iVar10 = ptr_04[(long)end_ref + 1];
            iVar11 = ptr_06[(long)end_ref + 1];
            iVar12 = ptr_07[(long)end_ref + 1];
            b_00[1] = (long)end_ref;
            iVar13 = ptr_08[b_00[1] + 1];
            a[1] = a_03[1];
            a[0] = lVar76;
            b_00[0] = (longlong)piVar75;
            alVar94 = _mm_max_epi64_rpl(a,b_00);
            b_01[0] = alVar94[1];
            a_00[1] = a_03[1];
            a_00[0] = lVar76;
            b_01[1] = b_00[1];
            alVar94 = _mm_cmpgt_epi64_rpl(a_00,b_01);
            b_02[0] = alVar94[1];
            auVar66._8_8_ = iVar11;
            auVar66._0_8_ = vFM[0];
            auVar65._8_8_ = iVar8;
            auVar65._0_8_ = vWM[0];
            auVar64._8_8_ = extraout_XMM0_Qb_01;
            auVar64._0_8_ = extraout_XMM0_Qa_01;
            register0x00001240 = pblendvb(auVar66,auVar65,auVar64);
            auVar63._8_8_ = iVar12;
            auVar63._0_8_ = vFS[0];
            auVar62._8_8_ = iVar9;
            auVar62._0_8_ = vWS[0];
            auVar61._8_8_ = extraout_XMM0_Qb_01;
            auVar61._0_8_ = extraout_XMM0_Qa_01;
            register0x00001240 = pblendvb(auVar63,auVar62,auVar61);
            auVar60._8_8_ = iVar13;
            auVar60._0_8_ = vFL[0];
            auVar59._8_8_ = iVar10;
            auVar59._0_8_ = vWL[0];
            auVar58._8_8_ = extraout_XMM0_Qb_01;
            auVar58._0_8_ = extraout_XMM0_Qa_01;
            auVar91 = pblendvb(auVar60,auVar59,auVar58);
            vJ[1] = auVar91._0_8_;
            vFL[0] = auVar91._8_8_;
            lVar78 = vJ[1] + 1;
            vFL[0] = vFL[0] + 1;
            a_01[1] = a_03[1];
            a_01[0] = lVar76;
            b_02[1] = b_00[1];
            alVar94 = _mm_max_epi64_rpl(a_01,b_02);
            b_03[0] = alVar94[1];
            a_02[1] = a_03[1];
            a_02[0] = lVar76;
            b_03[1] = b_00[1];
            _mm_cmpgt_epi64_rpl(a_02,b_03);
            auVar57._8_8_ = extraout_XMM0_Qb_03;
            auVar57._0_8_ = extraout_XMM0_Qa_03;
            auVar91 = pblendvb(stack0xffffffffffffef38,stack0xffffffffffffef98,auVar57);
            auVar56._8_8_ = extraout_XMM0_Qb_03;
            auVar56._0_8_ = extraout_XMM0_Qa_03;
            auVar92 = pblendvb(stack0xffffffffffffef28,stack0xffffffffffffef88,auVar56);
            auVar55._8_8_ = extraout_XMM0_Qb_03;
            auVar55._0_8_ = extraout_XMM0_Qa_03;
            auVar93 = pblendvb(stack0xffffffffffffef18,stack0xffffffffffffef78,auVar55);
            vF[1] = auVar93._0_8_;
            vEL[0] = auVar93._8_8_;
            b_00[1] = ptr_00[(long)end_ref + 1];
            b_04[1] = (long)piVar5[iVar1 * local_13c0 + ptr_00[(long)end_ref + 1]];
            a_03[1] = (size_t)(end_ref + -1);
            iVar2 = piVar6[b[1] + ptr_00[a_03[1] + 1]];
            b_13[1] = vNH[0] + b_04[1];
            a_03[0] = lVar76;
            b_04[0] = ptr_00[a_03[1] + 1];
            alVar94 = _mm_max_epi64_rpl(a_03,b_04);
            b_05[0] = alVar94[1];
            a_04[1] = a_03[1];
            a_04[0] = lVar76;
            b_05[1] = b_04[1];
            alVar94 = _mm_max_epi64_rpl(a_04,b_05);
            b_06[0] = alVar94[1];
            lVar79 = -(ulong)(extraout_XMM0_Qa_04 == lVar71 + iVar2);
            lVar85 = -(ulong)(extraout_XMM0_Qb_04 == b_13[1]);
            lVar80 = -(ulong)(extraout_XMM0_Qa_04 == extraout_XMM0_Qa_00);
            lVar86 = -(ulong)(extraout_XMM0_Qb_04 == extraout_XMM0_Qb_00);
            vES[1] = auVar91._0_8_;
            vEM[0] = auVar91._8_8_;
            auVar54._8_8_ = lVar86;
            auVar54._0_8_ = lVar80;
            auVar93 = pblendvb(auVar91,register0x00001240,auVar54);
            b_13[1] = -(ulong)(lVar3 == b_00[1]);
            auVar91._8_4_ = (int)b_13[1];
            auVar91._0_8_ = -(ulong)(lVar4 == vs2[0]);
            auVar91._12_4_ = (int)((ulong)b_13[1] >> 0x20);
            uStack_100 = auVar91._8_8_;
            auVar53._8_8_ = vNM[0] + (uStack_100 & 1);
            auVar53._0_8_ = lVar70 + (-(ulong)(lVar4 == vs2[0]) & 1);
            auVar52._8_8_ = lVar85;
            auVar52._0_8_ = lVar79;
            auVar91 = pblendvb(auVar93,auVar53,auVar52);
            vEL[1] = auVar92._0_8_;
            vES[0] = auVar92._8_8_;
            auVar51._8_8_ = lVar86;
            auVar51._0_8_ = lVar80;
            auVar92 = pblendvb(auVar92,register0x00001240,auVar51);
            a_05[1] = a_03[1];
            a_05[0] = lVar76;
            b_06[1] = b_04[1];
            alVar94 = _mm_cmpgt_epi64_rpl(a_05,b_06);
            b_07[0] = alVar94[1];
            auVar50._8_8_ = vNS[0] + (extraout_XMM0_Qb_05 & 1);
            auVar50._0_8_ = lVar69 + (extraout_XMM0_Qa_05 & 1);
            auVar49._8_8_ = lVar85;
            auVar49._0_8_ = lVar79;
            auVar92 = pblendvb(auVar92,auVar50,auVar49);
            auVar48._8_8_ = vEL[0] + 1U;
            auVar48._0_8_ = vF[1] + 1U;
            auVar47._8_8_ = vFL[0];
            auVar47._0_8_ = lVar78;
            auVar46._8_8_ = lVar86;
            auVar46._0_8_ = lVar80;
            auVar93 = pblendvb(auVar48,auVar47,auVar46);
            auVar45._8_8_ = vNL[0] + 1;
            auVar45._0_8_ = lVar68 + 1;
            auVar44._8_8_ = lVar85;
            auVar44._0_8_ = lVar79;
            auVar93 = pblendvb(auVar93,auVar45,auVar44);
            uVar81 = -(ulong)(vs1[1] == -1);
            uVar87 = -(ulong)(vJ[0] == -1);
            auVar43._8_8_ = extraout_XMM0_Qb_04;
            auVar43._0_8_ = extraout_XMM0_Qa_04;
            auVar42._8_8_ = vIBoundary[0];
            auVar42._0_8_ = case1[1];
            auVar41._8_8_ = uVar87;
            auVar41._0_8_ = uVar81;
            register0x00001240 = pblendvb(auVar43,auVar42,auVar41);
            vWS[1] = auVar91._0_8_;
            vWM[0] = auVar91._8_8_;
            vWS[1] = ~uVar81 & vWS[1];
            vWM[0] = ~uVar87 & vWM[0];
            vWL[1] = auVar92._0_8_;
            vWS[0] = auVar92._8_8_;
            vWL[1] = ~uVar81 & vWL[1];
            vWS[0] = ~uVar87 & vWS[0];
            vE[1] = auVar93._0_8_;
            vWL[0] = auVar93._8_8_;
            vE[1] = ~uVar81 & vE[1];
            vWL[0] = ~uVar87 & vWL[0];
            auVar40._8_8_ = extraout_XMM0_Qb_02;
            auVar40._0_8_ = extraout_XMM0_Qa_02;
            auVar93._8_8_ = rh;
            auVar93._0_8_ = rh;
            auVar92._8_8_ = uVar87;
            auVar92._0_8_ = uVar81;
            pblendvb(auVar40,auVar93,auVar92);
            vEM[0] = ~uVar87 & vEM[0];
            vES[1] = ~uVar81 & vES[1];
            vES[0] = ~uVar87 & vES[0];
            vEL[1] = ~uVar81 & vEL[1];
            uVar87 = (uVar87 ^ 0xffffffffffffffff) & vEL[0] + 1U;
            vEL[0]._0_4_ = (int)uVar87;
            vF[1] = (uVar81 ^ 0xffffffffffffffff) & vF[1] + 1U;
            vEL[0]._4_4_ = (int)(uVar87 >> 0x20);
            if (1 < end_ref) {
              a_06[1] = a_03[1];
              a_06[0] = lVar76;
              b_07[1] = b_04[1];
              alVar94 = _mm_min_epi64_rpl(a_06,b_07);
              b_08[0] = alVar94[1];
              a_07[1] = a_03[1];
              a_07[0] = lVar76;
              b_08[1] = b_04[1];
              alVar94 = _mm_max_epi64_rpl(a_07,b_08);
              b_09[0] = alVar94[1];
              a_08[1] = a_03[1];
              a_08[0] = lVar76;
              b_09[1] = b_04[1];
              alVar94 = _mm_max_epi64_rpl(a_08,b_09);
              b_10[0] = alVar94[1];
              a_09[1] = a_03[1];
              a_09[0] = lVar76;
              b_10[1] = b_04[1];
              alVar94 = _mm_max_epi64_rpl(a_09,b_10);
              b_11[0] = alVar94[1];
              a_10[1] = a_03[1];
              a_10[0] = lVar76;
              b_11[1] = b_04[1];
              alVar94 = _mm_max_epi64_rpl(a_10,b_11);
              b_12[0] = alVar94[1];
              a_11[1] = a_03[1];
              a_11[0] = lVar76;
              b_12[1] = b_04[1];
              _mm_max_epi64_rpl(a_11,b_12);
            }
            ptr_01[(long)(end_ref + -1) + 1] = vWM[1];
            ptr_02[(long)(end_ref + -1) + 1] = vWS[1];
            ptr_03[(long)(end_ref + -1) + 1] = vWL[1];
            ptr_04[(long)(end_ref + -1) + 1] = vE[1];
            ptr_05[(long)(end_ref + -1) + 1] = extraout_XMM0_Qa_00;
            ptr_06[(long)(end_ref + -1) + 1] = vFS[1];
            ptr_07[(long)(end_ref + -1) + 1] = vFL[1];
            b_13[1] = (long)(end_ref + -1);
            ptr_08[b_13[1] + 1] = lVar78;
            uVar87 = -(ulong)(vs1[1] == (long)s2Len + -1);
            uVar88 = -(ulong)(vJ[0] == (long)s2Len + -1);
            a_12[1] = a_03[1];
            a_12[0] = lVar76;
            b_13[0] = lVar78;
            alVar94 = _mm_cmpgt_epi64_rpl(a_12,b_13);
            b_14[0] = alVar94[1];
            a_13[1] = a_03[1];
            a_13[0] = lVar76;
            b_14[1] = b_13[1];
            alVar94 = _mm_cmplt_epi64_rpl(a_13,b_14);
            b_15[0] = alVar94[1];
            a_14[1] = a_03[1];
            a_14[0] = lVar76;
            b_15[1] = b_13[1];
            alVar94 = _mm_cmpgt_epi64_rpl(a_14,b_15);
            b_16[0] = alVar94[1];
            a_15[1] = a_03[1];
            a_15[0] = lVar76;
            b_16[1] = b_13[1];
            alVar94 = _mm_cmpgt_epi64_rpl(a_15,b_16);
            piVar75 = alVar94[1];
            uVar81 = uVar77 & uVar87;
            uVar89 = uVar84 & uVar88;
            uVar82 = extraout_XMM0_Qa_08 & uVar77 & extraout_XMM0_Qa_06 & extraout_XMM0_Qa_07;
            uVar90 = extraout_XMM0_Qb_08 & uVar84 & extraout_XMM0_Qb_06 & extraout_XMM0_Qb_07;
            uVar87 = extraout_XMM0_Qa_09 & extraout_XMM0_Qa & uVar87;
            uVar88 = extraout_XMM0_Qb_09 & extraout_XMM0_Qb & uVar88;
            auVar39._8_8_ = uVar90;
            auVar39._0_8_ = uVar82;
            register0x00001240 = pblendvb(stack0xfffffffffffff138,register0x00001240,auVar39);
            auVar38._8_8_ = vWM[0];
            auVar38._0_8_ = vWS[1];
            auVar37._8_8_ = uVar90;
            auVar37._0_8_ = uVar82;
            register0x00001240 = pblendvb(stack0xfffffffffffff128,auVar38,auVar37);
            auVar36._8_8_ = vWS[0];
            auVar36._0_8_ = vWL[1];
            auVar35._8_8_ = uVar90;
            auVar35._0_8_ = uVar82;
            register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar36,auVar35);
            auVar34._8_8_ = vWL[0];
            auVar34._0_8_ = vE[1];
            auVar33._8_8_ = uVar90;
            auVar33._0_8_ = uVar82;
            register0x00001240 = pblendvb(stack0xfffffffffffff108,auVar34,auVar33);
            auVar32._8_8_ = uVar88;
            auVar32._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xfffffffffffff0f8,register0x00001240,auVar32);
            auVar31._8_8_ = vWM[0];
            auVar31._0_8_ = vWS[1];
            auVar30._8_8_ = uVar88;
            auVar30._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xfffffffffffff0e8,auVar31,auVar30);
            auVar29._8_8_ = vWS[0];
            auVar29._0_8_ = vWL[1];
            auVar28._8_8_ = uVar88;
            auVar28._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xfffffffffffff0d8,auVar29,auVar28);
            auVar27._8_8_ = vWL[0];
            auVar27._0_8_ = vE[1];
            auVar26._8_8_ = uVar88;
            auVar26._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xfffffffffffff0c8,auVar27,auVar26);
            auVar25._8_8_ = uVar89;
            auVar25._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xfffffffffffff0b8,register0x00001240,auVar25);
            auVar24._8_8_ = vWM[0];
            auVar24._0_8_ = vWS[1];
            auVar23._8_8_ = uVar89;
            auVar23._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xfffffffffffff0a8,auVar24,auVar23);
            auVar22._8_8_ = vWS[0];
            auVar22._0_8_ = vWL[1];
            auVar21._8_8_ = uVar89;
            auVar21._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xfffffffffffff098,auVar22,auVar21);
            auVar20._8_8_ = vWL[0];
            auVar20._0_8_ = vE[1];
            auVar19._8_8_ = uVar89;
            auVar19._0_8_ = uVar81;
            register0x00001240 = pblendvb(stack0xfffffffffffff088,auVar20,auVar19);
            auVar18._8_8_ = vI[0];
            auVar18._0_8_ = vJreset[1];
            auVar17._8_8_ = uVar88;
            auVar17._0_8_ = uVar87;
            register0x00001240 = pblendvb(stack0xfffffffffffff078,auVar18,auVar17);
            auVar16._8_8_ = vJ[0];
            auVar16._0_8_ = vs1[1];
            auVar15._8_8_ = uVar90;
            auVar15._0_8_ = uVar82;
            register0x00001240 = pblendvb(stack0xfffffffffffff068,auVar16,auVar15);
            vs1[1] = vs1[1] + 1;
            vJ[0] = vJ[0] + 1;
            vs2[0] = b_00[1];
            vNL[0] = iVar10;
            vNS[0] = iVar9;
            vNM[0] = iVar8;
            vNH[0] = iVar7;
          }
          vJreset[1] = vJreset[1] + 2;
          vI[0] = vI[0] + 2;
          case1[1] = case1[1] - lStack_1390;
          vIBoundary[0] = vIBoundary[0] - lStack_1390;
        }
        rm = vMaxMRow;
        rs = vMaxSRow;
        rl = vMaxLRow;
        ch = vMaxHCol;
        cm = vMaxMCol;
        cs = vMaxSCol;
        cl = vMaxLCol;
        lh = vLastValH;
        lm = vLastValM;
        ls = vLastValS;
        ll = vLastValL;
        i_1 = vEndI;
        j_1 = vEndJ;
        plStack_1378 = vILimit;
        local_137c = 0;
        last_vall = (int64_t)rh;
        last_vals = (int64_t)rh;
        last_valm = (int64_t)rh;
        last_valh = (int64_t)rh;
        max_coll = (int64_t)rh;
        max_cols = (int64_t)rh;
        max_colm = (int64_t)rh;
        max_colh = (int64_t)rh;
        max_rowl = (int64_t)rh;
        max_rows = (int64_t)rh;
        max_rowm = (int64_t)rh;
        while( true ) {
          rm = rm + 1;
          rs = rs + 1;
          rl = rl + 1;
          ch = ch + 1;
          cm = cm + 1;
          cs = cs + 1;
          cl = cl + 1;
          lh = lh + 1;
          lm = lm + 1;
          ls = ls + 1;
          ll = ll + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_1378 = plStack_1378 + 1;
          if (1 < local_137c) break;
          if ((max_colm < *cm) ||
             ((*cm == max_colm && (uVar77 = (ulong)NEG_LIMIT._4_4_, *j_1 < (long)uVar77)))) {
            max_colm = *cm;
            NEG_LIMIT._4_4_ = (int)*j_1;
            max_cols = *cs;
            max_coll = *cl;
            last_valh = *lh;
          }
          if (max_rowm < *rm) {
            max_rowm = *rm;
            NEG_LIMIT._0_4_ = (uint)*plStack_1378;
            max_rows = *rs;
            max_rowl = *rl;
            max_colh = *ch;
          }
          if (last_valm < *lm) {
            last_valm = *lm;
            last_vals = *ls;
            last_vall = *ll;
            rh = (int64_t *)*i_1;
          }
          local_137c = local_137c + 1;
        }
        matches._0_4_ = (int)max_colm;
        iVar73 = (int)matches;
        similar._0_4_ = (int)max_cols;
        iVar72 = (int)similar;
        length._0_4_ = (int)max_coll;
        iVar2 = (int)length;
        local_dd0 = (int)last_valh;
        iVar1 = local_dd0;
        matches._0_4_ = (int)max_rowm;
        similar._0_4_ = (int)max_rows;
        length._0_4_ = (int)max_rowl;
        local_dd0 = (int)max_colh;
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              matches._0_4_ = (int)last_valm;
              NEG_LIMIT._0_4_ = s2Len - 1;
              similar._0_4_ = (int)last_vals;
              length._0_4_ = (int)last_vall;
              local_dd0 = (int)rh;
            }
            NEG_LIMIT._4_4_ = local_1380 + -1;
          }
          else {
            NEG_LIMIT._0_4_ = s2Len - 1;
            matches._0_4_ = iVar73;
            similar._0_4_ = iVar72;
            length._0_4_ = iVar2;
            local_dd0 = iVar1;
          }
        }
        else if ((max_rowm < max_colm) ||
                ((max_colm == max_rowm &&
                 (uVar77 = (ulong)(s2Len - 1U), (uint)NEG_LIMIT == s2Len - 1U)))) {
          NEG_LIMIT._0_4_ = s2Len - 1;
          matches._0_4_ = iVar73;
          similar._0_4_ = iVar72;
          length._0_4_ = iVar2;
          local_dd0 = iVar1;
        }
        else {
          NEG_LIMIT._4_4_ = local_1380 + -1;
        }
        a_16[1] = a_03[1];
        a_16[0] = lVar76;
        b_17[1] = uVar77;
        b_17[0] = (longlong)piVar75;
        alVar94 = _mm_cmplt_epi64_rpl(a_16,b_17);
        b_18[0] = alVar94[1];
        a_17[1] = a_03[1];
        a_17[0] = lVar76;
        b_18[1] = uVar77;
        _mm_cmpgt_epi64_rpl(a_17,b_18);
        uVar77 = extraout_XMM0_Qb_10 | extraout_XMM0_Qb_11;
        auVar67._8_8_ = uVar77;
        auVar67._0_8_ = extraout_XMM0_Qa_10 | extraout_XMM0_Qa_11;
        if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar77 >> 7 & 1) != 0) || (uVar77 >> 0xf & 1) != 0) || (uVar77 >> 0x17 & 1) != 0)
               || (uVar77 >> 0x1f & 1) != 0) || (uVar77 >> 0x27 & 1) != 0) ||
             (uVar77 >> 0x2f & 1) != 0) || (uVar77 >> 0x37 & 1) != 0) || (long)uVar77 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          matches._0_4_ = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          local_dd0 = 0;
          NEG_LIMIT._4_4_ = 0;
          NEG_LIMIT._0_4_ = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)matches;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT._4_4_;
        ((parasail_result_t *)_s1_local)->end_ref = (uint)NEG_LIMIT;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->matches = (int)similar;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar = (int)length;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = local_dd0;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxMRow;
    __m128i vMaxSRow;
    __m128i vMaxLRow;
    __m128i vMaxHCol;
    __m128i vMaxMCol;
    __m128i vMaxSCol;
    __m128i vMaxLCol;
    __m128i vLastValH;
    __m128i vLastValM;
    __m128i vLastValS;
    __m128i vLastValL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxMRow = vNegInf;
    vMaxSRow = vNegInf;
    vMaxLRow = vNegInf;
    vMaxHCol = vNegInf;
    vMaxMCol = vNegInf;
    vMaxSCol = vNegInf;
    vMaxLCol = vNegInf;
    vLastValH = vNegInf;
    vLastValM = vNegInf;
    vLastValS = vNegInf;
    vLastValL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vNegInf;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxMRow = _mm_blendv_epi8(vMaxMRow, vWM, cond_all_row);
                vMaxSRow = _mm_blendv_epi8(vMaxSRow, vWS, cond_all_row);
                vMaxLRow = _mm_blendv_epi8(vMaxLRow, vWL, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vMaxMCol = _mm_blendv_epi8(vMaxMCol, vWM, cond_all_col);
                vMaxSCol = _mm_blendv_epi8(vMaxSCol, vWS, cond_all_col);
                vMaxLCol = _mm_blendv_epi8(vMaxLCol, vWL, cond_all_col);
                vLastValH = _mm_blendv_epi8(vLastValH, vWH, cond_last_val);
                vLastValM = _mm_blendv_epi8(vLastValM, vWM, cond_last_val);
                vLastValS = _mm_blendv_epi8(vLastValS, vWS, cond_last_val);
                vLastValL = _mm_blendv_epi8(vLastValL, vWL, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_rowh = NEG_LIMIT;
        int64_t max_rowm = NEG_LIMIT;
        int64_t max_rows = NEG_LIMIT;
        int64_t max_rowl = NEG_LIMIT;
        int64_t max_colh = NEG_LIMIT;
        int64_t max_colm = NEG_LIMIT;
        int64_t max_cols = NEG_LIMIT;
        int64_t max_coll = NEG_LIMIT;
        int64_t last_valh = NEG_LIMIT;
        int64_t last_valm = NEG_LIMIT;
        int64_t last_vals = NEG_LIMIT;
        int64_t last_vall = NEG_LIMIT;
        int64_t *rh = (int64_t*)&vMaxHRow;
        int64_t *rm = (int64_t*)&vMaxMRow;
        int64_t *rs = (int64_t*)&vMaxSRow;
        int64_t *rl = (int64_t*)&vMaxLRow;
        int64_t *ch = (int64_t*)&vMaxHCol;
        int64_t *cm = (int64_t*)&vMaxMCol;
        int64_t *cs = (int64_t*)&vMaxSCol;
        int64_t *cl = (int64_t*)&vMaxLCol;
        int64_t *lh = (int64_t*)&vLastValH;
        int64_t *lm = (int64_t*)&vLastValM;
        int64_t *ls = (int64_t*)&vLastValS;
        int64_t *ll = (int64_t*)&vLastValL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++rh, ++rm, ++rs, ++rl, ++ch, ++cm, ++cs, ++cl, ++lh, ++lm, ++ls, ++ll, ++i, ++j) {
            if (*ch > max_colh || (*ch == max_colh && *i < end_query)) {
                max_colh = *ch;
                end_query = *i;
                max_colm = *cm;
                max_cols = *cs;
                max_coll = *cl;
            }
            if (*rh > max_rowh) {
                max_rowh = *rh;
                end_ref = *j;
                max_rowm = *rm;
                max_rows = *rs;
                max_rowl = *rl;
            }
            if (*lh > last_valh) {
                last_valh = *lh;
                last_valm = *lm;
                last_vals = *ls;
                last_vall = *ll;
            }
        }
        if (s1_end && s2_end) {
            if (max_colh > max_rowh || (max_colh == max_rowh && end_ref == s2Len-1)) {
                score = max_colh;
                end_ref = s2Len-1;
                matches = max_colm;
                similar = max_cols;
                length = max_coll;
            }
            else {
                score = max_rowh;
                end_query = s1Len-1;
                matches = max_rowm;
                similar = max_rows;
                length = max_rowl;
            }
        }
        else if (s1_end) {
            score = max_colh;
            end_ref = s2Len-1;
            matches = max_colm;
            similar = max_cols;
            length = max_coll;
        }
        else if (s2_end) {
            score = max_rowh;
            end_query = s1Len-1;
            matches = max_rowm;
            similar = max_rows;
            length = max_rowl;
        }
        else {
            score = last_valh;
            end_query = s1Len-1;
            end_ref = s2Len-1;
            matches = last_valm;
            similar = last_vals;
            length = last_vall;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}